

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

float64 vector_dist_eucl(float32 *v1,float32 *v2,int32 len)

{
  ulong uVar1;
  ulong uVar2;
  float64 fVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = uVar1;
  }
  fVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    fVar3 = (float64)((double)fVar3 +
                     (double)(((float)v1[uVar1] - (float)v2[uVar1]) *
                             ((float)v1[uVar1] - (float)v2[uVar1])));
  }
  return fVar3;
}

Assistant:

float64
vector_dist_eucl(float32 * v1, float32 * v2, int32 len)
{
    float64 d;
    int32 i;

    d = 0.0;
    for (i = 0; i < len; i++)
        d += (v1[i] - v2[i]) * (v1[i] - v2[i]);

    return d;
}